

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_saveg.cpp
# Opt level: O2

FSerializer * Serialize(FSerializer *arc,char *key,FPolyObj *poly,FPolyObj *def)

{
  bool bVar1;
  FSerializer *pFVar2;
  DAngle angle;
  TVector2<double> local_38;
  DAngle local_28;
  
  bVar1 = FSerializer::BeginObject(arc,key);
  if (bVar1) {
    angle.Degrees = (poly->Angle).Degrees;
    local_38.X = (poly->StartSpot).pos.X;
    local_38.Y = (poly->StartSpot).pos.Y;
    pFVar2 = FSerializer::operator()(arc,"angle",&angle);
    pFVar2 = FSerializer::operator()(pFVar2,"pos",&local_38);
    pFVar2 = FSerializer::operator()(pFVar2,"interpolation",&poly->interpolation);
    pFVar2 = FSerializer::operator()(pFVar2,"blocked",&poly->bBlocked);
    pFVar2 = FSerializer::operator()(pFVar2,"hasportals",&poly->bHasPortals);
    pFVar2 = FSerializer::operator()(pFVar2,"specialdata",&poly->specialdata);
    FSerializer::EndObject(pFVar2);
    if (arc->r != (FReader *)0x0) {
      local_28.Degrees = angle.Degrees;
      FPolyObj::RotatePolyobj(poly,&local_28,true);
      local_38.X = local_38.X - (poly->StartSpot).pos.X;
      local_38.Y = local_38.Y - (poly->StartSpot).pos.Y;
      FPolyObj::MovePolyobj(poly,&local_38,true);
    }
  }
  return arc;
}

Assistant:

FSerializer &Serialize(FSerializer &arc, const char *key, FPolyObj &poly, FPolyObj *def)
{
	if (arc.BeginObject(key))
	{
		DAngle angle = poly.Angle;
		DVector2 delta = poly.StartSpot.pos;
		arc("angle", angle)
			("pos", delta)
			("interpolation", poly.interpolation)
			("blocked", poly.bBlocked)
			("hasportals", poly.bHasPortals)
			("specialdata", poly.specialdata)
			.EndObject();

		if (arc.isReading())
		{
			poly.RotatePolyobj(angle, true);
			delta -= poly.StartSpot.pos;
			poly.MovePolyobj(delta, true);
		}
	}
	return arc;
}